

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O2

void RigidBodyDynamics::Utils::CalcZeroMomentPoint
               (Model *model,VectorNd *q,VectorNd *qdot,VectorNd *qddot,Vector3d *zmp,
               Vector3d *normal,Vector3d *point,bool update_kinematics)

{
  double dVar1;
  pointer pSVar2;
  pointer pSVar3;
  double dVar4;
  double dVar5;
  Scalar SVar6;
  RBDLError *this;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  SpatialVector *pSVar11;
  long lVar12;
  SpatialTransform local_238;
  SpatialTransform Xcom;
  SpatialVector h_tot;
  string local_148;
  SpatialRigidBodyInertia local_128;
  SpatialVector hdot_tot;
  Vector3d n_0;
  undefined1 local_78 [24];
  Vector3d f;
  Vector3d com;
  
  if (zmp != (Vector3d *)0x0) {
    if (update_kinematics) {
      UpdateKinematicsCustom(model,q,qdot,qddot);
    }
    lVar12 = 0x30;
    lVar7 = 0x50;
    for (uVar9 = 1;
        uVar9 < (ulong)(((long)(model->mBodies).
                               super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               .
                               super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(model->mBodies).
                              super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                              .
                              super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x70); uVar9 = uVar9 + 1)
    {
      Math::SpatialRigidBodyInertia::operator=
                ((SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar7 + -8),
                 (SpatialRigidBodyInertia *)
                 ((long)&(((model->I).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar7 + -8));
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialVector *)&Xcom,
                 (SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar7 + -8),
                 (SpatialVector *)
                 ((long)&(((model->a).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar12));
      pSVar11 = (SpatialVector *)
                ((long)&(((model->v).
                          super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                          super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super_Matrix<double,_6,_1,_0,_6,_1>).
                        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar12);
      Math::SpatialRigidBodyInertia::operator*
                ((SpatialVector *)&local_128,
                 (SpatialRigidBodyInertia *)
                 ((long)&(((model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start)->h).super_Vector3d +
                 lVar7 + -8),pSVar11);
      Math::crossf(pSVar11,(SpatialVector *)&local_128);
      h_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
           (double)&Xcom;
      h_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
           (double)&local_238;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                ((Matrix<double,_6,_1,_0,_6,_1> *)
                 ((long)&(((model->hdotc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_Matrix<double,_6,_1,_0,_6,_1>).
                         super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar12),
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&h_tot);
      lVar12 = lVar12 + 0x30;
      lVar7 = lVar7 + 0x50;
    }
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&Xcom,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&local_238);
    local_128.m = 0.0;
    local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[0] = 0.0;
    local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[1] = 0.0;
    local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
    m_storage.m_data.array[2] = 0.0;
    local_128.Ixx =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    local_128.Iyx =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[1];
    local_128.Iyy =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[4];
    local_128.Izx =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[2];
    local_128.Izy =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[5];
    local_128.Izz =
         Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[8];
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&h_tot,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&Xcom);
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1] = 0.0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
    _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&hdot_tot,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&Xcom);
    lVar12 = ((long)(model->mBodies).
                    super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    .
                    super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(model->mBodies).
                   super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   .
                   super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x70;
    lVar7 = lVar12 * 0x60;
    lVar8 = lVar12 * 0x30;
    lVar10 = lVar12 * 0x50;
    while( true ) {
      SVar6 = local_128.m;
      lVar12 = lVar12 + -1;
      if (lVar12 == 0) break;
      uVar9 = (ulong)(model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar12];
      if (uVar9 == 0) {
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)&local_238,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialRigidBodyInertia *)
                   ((long)&(model->Ic).
                           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].h.super_Vector3d +
                   lVar10 + -8));
        Math::SpatialRigidBodyInertia::operator+
                  ((SpatialRigidBodyInertia *)&Xcom,&local_128,(SpatialRigidBodyInertia *)&local_238
                  );
        local_128.m = Xcom.E.super_Matrix3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                      array[0];
        local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[2] =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[3];
        local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[0] =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1];
        local_128.h.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
        m_storage.m_data.array[1] =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
        local_128.Izy =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[8];
        local_128.Izz =
             Xcom.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        local_128.Iyy =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6];
        local_128.Izx =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[7];
        local_128.Ixx =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
        local_128.Iyx =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[5];
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialVector *)
                   ((long)&(model->hc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar8));
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = (double)&h_tot;
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = (double)&Xcom;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                  ((Matrix<double,_6,_1,_0,_6,_1> *)
                   local_238.E.super_Matrix3d.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                   array[0],(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                             *)&local_238);
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialVector *)
                   ((long)&(model->hdotc).
                           super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           .
                           super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].
                           super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar8));
        pSVar11 = &hdot_tot;
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = (double)pSVar11;
      }
      else {
        pSVar2 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialRigidBodyInertia *)&local_238,
                   (SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialRigidBodyInertia *)((long)&pSVar2[-1].h.super_Vector3d + lVar10 + -8));
        Math::SpatialRigidBodyInertia::operator+
                  ((SpatialRigidBodyInertia *)&Xcom,pSVar2 + uVar9,
                   (SpatialRigidBodyInertia *)&local_238);
        pSVar2 = (model->Ic).
                 super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar2[uVar9].m =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[0];
        *(double *)&pSVar2[uVar9].h.super_Vector3d =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[1];
        *(double *)((long)&pSVar2[uVar9].h.super_Vector3d + 8) =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[2];
        *(double *)((long)&pSVar2[uVar9].h.super_Vector3d + 0x10) =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[3];
        pSVar2[uVar9].Ixx =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[4];
        (&pSVar2[uVar9].Ixx)[1] =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[5];
        pSVar2[uVar9].Iyy =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[6];
        (&pSVar2[uVar9].Iyy)[1] =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[7];
        pSVar2[uVar9].Izy =
             Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
             m_storage.m_data.array[8];
        (&pSVar2[uVar9].Izy)[1] =
             Xcom.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
        pSVar3 = (model->hc).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialVector *)
                   ((long)&pSVar3[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar8));
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = (double)(pSVar3 + uVar9);
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[1] = (double)&Xcom;
        Eigen::internal::
        call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                  (&(model->hc).
                    super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar9].
                    super_Matrix<double,_6,_1,_0,_6,_1>,
                   (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                    *)&local_238);
        pSVar3 = (model->hdotc).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)
                   ((long)&(model->X_lambda).
                           super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           .
                           super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].E.super_Matrix3d + lVar7),
                   (SpatialVector *)
                   ((long)&pSVar3[-1].super_Matrix<double,_6,_1,_0,_6,_1>.
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + lVar8));
        pSVar11 = (model->hdotc).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar9;
        local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
        m_storage.m_data.array[0] = (double)(pSVar3 + uVar9);
      }
      local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = (double)&Xcom;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Matrix<double,6,1,0,6,1>const>>
                (&pSVar11->super_Matrix<double,_6,_1,_0,_6,_1>,
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                  *)&local_238);
      lVar7 = lVar7 + -0x60;
      lVar8 = lVar8 + -0x30;
      lVar10 = lVar10 + -0x50;
    }
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] = (double)&local_128.h;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[2] = local_128.m;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&com,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&Xcom);
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[1] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[2] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[3] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[5] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[6] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[7] = 0.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[0] = 1.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[4] = 1.0;
    Xcom.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
    m_data.array[8] = 1.0;
    Xcom.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0] =
         com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    Xcom.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[1] =
         com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    Xcom.r.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
    m_data.array[2] =
         com.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    Math::SpatialTransform::applyAdjoint((SpatialVector *)&local_238,&Xcom,&hdot_tot);
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[4];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[5];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[2];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[3];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[0];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
         m_storage.m_data.array[1];
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[4] = (double)&n_0;
    n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[2] = 0.0;
    n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[0] = 0.0;
    n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
    .array[1] = 0.0;
    dVar4 = (model->gravity).super_Vector3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    dVar5 = (model->gravity).super_Vector3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    dVar1 = (model->gravity).super_Vector3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = SVar6;
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = (double)&hdot_tot;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,6,1,0,6,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,6,1,0,6,1>const>const,Eigen::Matrix<double,6,1,0,6,1>const>const>>
              (&hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>,
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                *)&local_238);
    Math::SpatialTransform::inverse(&local_238,&Xcom);
    Math::SpatialTransform::applyAdjoint((SpatialVector *)&n_0,&local_238,&hdot_tot);
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 0.0;
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
         n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[2];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
         n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0];
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
         n_0.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1];
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 2.96439387504748e-323;
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = (double)&hdot_tot;
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = (double)&hdot_tot;
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] = dVar4;
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] = dVar5;
    hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] = dVar1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&n_0,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *)
               &local_238);
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[3] = 1.48219693752374e-323;
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[5] = 2.96439387504748e-323;
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] =
         (double)(hdot_tot.super_Matrix<double,_6,_1,_0,_6,_1>.
                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                  array + 3);
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] = (double)&hdot_tot;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false>_> *)
               &local_238);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::cross<Eigen::Matrix<double,3,1,0,3,1>>
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)normal,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&n_0);
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[2] =
         Eigen::internal::
         dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
         ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)normal,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&f);
    local_238.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
    m_storage.m_data.array[0] = (double)local_78;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              (&zmp->super_Vector3d,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_238);
    return;
  }
  this = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"ZMP (output) is \'NULL\'!\n",(allocator<char> *)&Xcom);
  Errors::RBDLError::RBDLError(this,&local_148);
  __cxa_throw(this,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

RBDL_DLLAPI void CalcZeroMomentPoint (
  Model &model,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot,
  const Math::VectorNd &qddot,
  Vector3d* zmp,
  const Math::Vector3d &normal,
  const Math::Vector3d &point,
  bool update_kinematics
)
{
  if (zmp == NULL) {
    throw Errors::RBDLError("ZMP (output) is 'NULL'!\n");
  }

  // update kinematics if required
  // NOTE UpdateKinematics computes model.a[i] and model.v[i] required for
  //      change of momentum
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &q, &qdot, &qddot);
  }

  // compute change of momentum of each single body (same as in RNEA/InverseDynamics)
  for (size_t i = 1; i < model.mBodies.size(); i++) {
    model.Ic[i] = model.I[i];
    model.hdotc[i] = model.Ic[i] * model.a[i] + crossf(model.v[i],
                     model.Ic[i] * model.v[i]);
  }

  SpatialRigidBodyInertia I_tot (0., Vector3d (0., 0., 0.), Matrix3d::Zero());
  SpatialVector h_tot (SpatialVector::Zero());
  SpatialVector hdot_tot (SpatialVector::Zero());

  // compute total change of momentum and CoM wrt to root body (idx = 0)
  // by recursively summing up local change of momentum
  for (size_t i = model.mBodies.size() - 1; i > 0; i--) {
    unsigned int lambda = model.lambda[i];

    if (lambda != 0) {
      model.Ic[lambda] = model.Ic[lambda] + model.X_lambda[i].applyTranspose (
                           model.Ic[i]);
      model.hc[lambda] = model.hc[lambda] + model.X_lambda[i].applyTranspose (
                           model.hc[i]);
      model.hdotc[lambda] = model.hdotc[lambda] + model.X_lambda[i].applyTranspose (
                              model.hdotc[i]);
    } else {
      I_tot = I_tot + model.X_lambda[i].applyTranspose (model.Ic[i]);
      h_tot = h_tot + model.X_lambda[i].applyTranspose (model.hc[i]);
      hdot_tot = hdot_tot + model.X_lambda[i].applyTranspose (model.hdotc[i]);
    }
  }

  // compute CoM from mass and total inertia
  const Scalar mass = I_tot.m;
  const Vector3d com = I_tot.h / mass;

  // project angular momentum onto CoM
  SpatialTransform Xcom = Xtrans (com);
  hdot_tot = Xcom.applyAdjoint (hdot_tot);

  // compute net external force at CoM by removing effects due to gravity
  hdot_tot = hdot_tot - mass * SpatialVector (0., 0., 0., model.gravity[0],
             model.gravity[1], model.gravity[2]);

  // express total change of momentum in world coordinates
  hdot_tot = Xcom.inverse().applyAdjoint (hdot_tot);

  // project purified change of momentum onto surface
  // z = n x n_0
  //     -------
  //     n * f
  Vector3d n_0 = hdot_tot.block<3,1>(0,0);
  Vector3d f = hdot_tot.block<3,1>(3,0);
  *zmp = normal.cross(n_0) / normal.dot(f);

  // double distance = (hdot_tot - point).dot(normal);
  // zmp = hdot_tot - distance * normal;

  return;
}